

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlFAParsePosCharGroup(xmlRegParserCtxtPtr ctxt)

{
  bool bVar1;
  xmlRegParserCtxtPtr ctxt_local;
  
  do {
    if (*ctxt->cur == '\\') {
      xmlFAParseCharClassEsc(ctxt);
    }
    else {
      xmlFAParseCharRange(ctxt);
    }
    bVar1 = false;
    if (((*ctxt->cur != ']') && (bVar1 = false, *ctxt->cur != '-')) &&
       (bVar1 = false, *ctxt->cur != '\0')) {
      bVar1 = ctxt->error == 0;
    }
  } while (bVar1);
  return;
}

Assistant:

static void
xmlFAParsePosCharGroup(xmlRegParserCtxtPtr ctxt) {
    do {
	if (CUR == '\\') {
	    xmlFAParseCharClassEsc(ctxt);
	} else {
	    xmlFAParseCharRange(ctxt);
	}
    } while ((CUR != ']') && (CUR != '-') &&
             (CUR != 0) && (ctxt->error == 0));
}